

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_rkv.c
# Opt level: O1

MPP_RET hal_jpegd_rkv_control(void *hal,MpiCmd cmd_type,void *param)

{
  uint uVar1;
  RockchipSocType RVar2;
  uint uVar3;
  char *fname;
  char *fmt;
  int level;
  ulong uVar4;
  bool bVar5;
  
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","enter\n","hal_jpegd_rkv_control");
  }
  if (hal == (void *)0x0) {
    _mpp_log_l(2,"hal_jpegd_rkv","NULL pointer","hal_jpegd_rkv_control");
    return MPP_ERR_NULL_PTR;
  }
  uVar4 = 0;
  if (cmd_type == MPP_DEC_SET_OUTPUT_FORMAT) {
    uVar1 = *param;
    RVar2 = mpp_get_soc_type();
    uVar3 = 0xfffffffa;
    if ((uVar1 & 0xf00000) == 0) {
      uVar3 = 0;
    }
    if (((uVar1 >> 0x19 & 1) != 0) &&
       ((RVar2 < ROCKCHIP_SOC_RK3576 ||
        ((uVar1 & 0xfffff) < 0x10010 && (uVar1 & 0xf0000) == 0x10000)))) {
      uVar3 = 0xfffffffa;
    }
    if ((uVar1 & 0xfffff) < 0x10010 && (uVar1 & 0xf0000) == 0x10000) {
      uVar4 = 0xfffffffa;
      if (RVar2 < ROCKCHIP_SOC_RK3576) {
        if (RVar2 < ROCKCHIP_SOC_RK3588) {
          bVar5 = uVar1 == 0x10006;
        }
        else {
          bVar5 = (uVar1 & 0xfff1fffb) == 0x10002;
        }
        uVar4 = 0xfffffffa;
        if (bVar5) {
          uVar4 = (ulong)uVar3;
        }
      }
    }
    else {
      uVar4 = (ulong)uVar3;
    }
    if ((int)uVar4 == 0) {
      *(uint *)((long)hal + 0x90) = uVar1;
      *(undefined4 *)((long)hal + 0x94) = 1;
      if (((byte)jpegd_debug & 0x80) == 0) goto LAB_00214c2c;
      fmt = "output_format: 0x%x\n";
      level = 4;
      fname = (char *)0x0;
    }
    else {
      fmt = "invalid output format 0x%x\n";
      fname = "hal_jpegd_rkv_control";
      level = 2;
    }
    _mpp_log_l(level,"hal_jpegd_rkv",fmt,fname,(ulong)uVar1);
  }
LAB_00214c2c:
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpegd_rkv","exit ret %d\n","hal_jpegd_rkv_control",uVar4);
  }
  return (MPP_RET)uVar4;
}

Assistant:

MPP_RET hal_jpegd_rkv_control(void *hal, MpiCmd cmd_type, void *param)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;

    if (NULL == JpegHalCtx) {
        mpp_err_f("NULL pointer");
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd_type) {
    case MPP_DEC_SET_OUTPUT_FORMAT: {
        MppFrameFormat output_fmt = *((MppFrameFormat *)param);
        RockchipSocType soc_type = mpp_get_soc_type();
        MppFrameFormat frm_fmt = output_fmt & MPP_FRAME_FMT_MASK;

        if (MPP_FRAME_FMT_IS_FBC(output_fmt)) {
            ret = MPP_ERR_VALUE;
        }

        if (MPP_FRAME_FMT_IS_TILE(output_fmt)) {
            if (soc_type < ROCKCHIP_SOC_RK3576 || MPP_FRAME_FMT_IS_RGB(output_fmt)) {
                ret = MPP_ERR_VALUE;
            }
        }

        if (MPP_FRAME_FMT_IS_RGB(output_fmt)) {
            // The new JPEG decoder defaults to no RGB support.
            if (soc_type >= ROCKCHIP_SOC_RK3576) {
                ret = MPP_ERR_VALUE;
            } else if (soc_type >= ROCKCHIP_SOC_RK3588) {
                // only rgb565be and rgb888 supported
                if (output_fmt != MPP_FMT_RGB555 && output_fmt != MPP_FMT_RGB888 ) {
                    ret = MPP_ERR_VALUE;
                }
            } else {
                // only bgr565le and rgb 888 supported
                if (frm_fmt != (MPP_FMT_BGR565 | MPP_FRAME_FMT_LE_MASK)
                    && output_fmt != MPP_FMT_RGB888) {
                    ret = MPP_ERR_VALUE;
                }
            }
        }

        if (ret) {
            mpp_err_f("invalid output format 0x%x\n", output_fmt);
        } else {
            JpegHalCtx->output_fmt = output_fmt;
            JpegHalCtx->set_output_fmt_flag = 1;
            jpegd_dbg_hal("output_format: 0x%x\n", JpegHalCtx->output_fmt);
        }
    } break;
    //TODO support scale and tile output
    default :
        break;
    }

    jpegd_dbg_func("exit ret %d\n", ret);
    return ret;
}